

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprPhraseIsMatch(Fts5ExprNode *pNode,Fts5ExprPhrase *pPhrase,int *pbMatch)

{
  bool bVar1;
  int iVar2;
  Fts5PoslistReader *pIter;
  long lVar3;
  i64 iAdj;
  Fts5PoslistReader *pPos;
  i64 iPos;
  undefined1 auStack_100 [4];
  int bMatch;
  Fts5Buffer buf;
  u8 *a;
  int bFlag;
  int n;
  Fts5ExprTerm *pTerm;
  sqlite3_int64 nByte;
  int local_c8;
  int bFirst;
  int rc;
  int i;
  Fts5PoslistReader *aIter;
  Fts5PoslistReader aStatic [4];
  Fts5PoslistWriter local_30;
  Fts5PoslistWriter writer;
  int *pbMatch_local;
  Fts5ExprPhrase *pPhrase_local;
  Fts5ExprNode *pNode_local;
  
  writer.iPrev = (i64)pbMatch;
  memset(&local_30,0,8);
  _rc = &aIter;
  local_c8 = 0;
  nByte._4_4_ = (uint)pPhrase->aTerm[0].bFirst;
  sqlite3Fts5BufferZero(&pPhrase->poslist);
  if (4 < pPhrase->nTerm) {
    pTerm = (Fts5ExprTerm *)((long)pPhrase->nTerm << 5);
    _rc = (Fts5PoslistReader **)sqlite3_malloc64((sqlite3_uint64)pTerm);
    if (_rc == (Fts5PoslistReader **)0x0) {
      return 7;
    }
  }
  memset(_rc,0,(long)pPhrase->nTerm << 5);
  bFirst = 0;
  do {
    if (pPhrase->nTerm <= bFirst) {
      while( true ) {
        pPos = _rc[3];
        do {
          bVar1 = true;
          for (bFirst = 0; bFirst < pPhrase->nTerm; bFirst = bFirst + 1) {
            pIter = (Fts5PoslistReader *)(_rc + (long)bFirst * 4);
            lVar3 = (long)&pPos->a + (long)bFirst;
            if (pIter->iPos != lVar3) {
              bVar1 = false;
              while (pIter->iPos < lVar3) {
                iVar2 = sqlite3Fts5PoslistReaderNext(pIter);
                if (iVar2 != 0) goto LAB_0027a3aa;
              }
              if (lVar3 < pIter->iPos) {
                pPos = (Fts5PoslistReader *)(pIter->iPos - (long)bFirst);
              }
            }
          }
        } while (!bVar1);
        if (((nByte._4_4_ == 0) || (((ulong)pPos & 0x7fffffff) == 0)) &&
           (local_c8 = sqlite3Fts5PoslistWriterAppend(&pPhrase->poslist,&local_30,(i64)pPos),
           local_c8 != 0)) break;
        for (bFirst = 0; bFirst < pPhrase->nTerm; bFirst = bFirst + 1) {
          iVar2 = sqlite3Fts5PoslistReaderNext((Fts5PoslistReader *)(_rc + (long)bFirst * 4));
          if (iVar2 != 0) goto LAB_0027a3aa;
        }
      }
LAB_0027a3aa:
      *(uint *)writer.iPrev = (uint)(0 < (pPhrase->poslist).n);
      for (bFirst = 0; bFirst < pPhrase->nTerm; bFirst = bFirst + 1) {
        if (*(char *)(_rc + (long)bFirst * 4 + 2) != '\0') {
          sqlite3_free(_rc[(long)bFirst * 4]);
        }
      }
      if (_rc != &aIter) {
        sqlite3_free(_rc);
      }
      return local_c8;
    }
    _bFlag = pPhrase->aTerm + bFirst;
    a._4_4_ = 0;
    a._0_4_ = 0;
    buf.n = 0;
    buf.nSpace = 0;
    if (_bFlag->pSynonym == (Fts5ExprTerm *)0x0) {
      buf._8_8_ = _bFlag->pIter->pData;
      a._4_4_ = _bFlag->pIter->nData;
    }
    else {
      memset(auStack_100,0,0x10);
      local_c8 = fts5ExprSynonymList(_bFlag,pNode->iRowid,(Fts5Buffer *)auStack_100,(u8 **)&buf.n,
                                     (int *)((long)&a + 4));
      if (local_c8 != 0) {
        sqlite3_free((void *)buf._8_8_);
        goto LAB_0027a3aa;
      }
      if ((u8 *)buf._8_8_ == _auStack_100) {
        a._0_4_ = 1;
      }
    }
    sqlite3Fts5PoslistReaderInit
              ((u8 *)buf._8_8_,a._4_4_,(Fts5PoslistReader *)(_rc + (long)bFirst * 4));
    *(char *)(_rc + (long)bFirst * 4 + 2) = (char)a._0_4_;
    if (*(char *)((long)_rc + (long)bFirst * 0x20 + 0x11) != '\0') goto LAB_0027a3aa;
    bFirst = bFirst + 1;
  } while( true );
}

Assistant:

static int fts5ExprPhraseIsMatch(
  Fts5ExprNode *pNode,            /* Node pPhrase belongs to */
  Fts5ExprPhrase *pPhrase,        /* Phrase object to initialize */
  int *pbMatch                    /* OUT: Set to true if really a match */
){
  Fts5PoslistWriter writer = {0};
  Fts5PoslistReader aStatic[4];
  Fts5PoslistReader *aIter = aStatic;
  int i;
  int rc = SQLITE_OK;
  int bFirst = pPhrase->aTerm[0].bFirst;
  
  fts5BufferZero(&pPhrase->poslist);

  /* If the aStatic[] array is not large enough, allocate a large array
  ** using sqlite3_malloc(). This approach could be improved upon. */
  if( pPhrase->nTerm>ArraySize(aStatic) ){
    sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * pPhrase->nTerm;
    aIter = (Fts5PoslistReader*)sqlite3_malloc64(nByte);
    if( !aIter ) return SQLITE_NOMEM;
  }
  memset(aIter, 0, sizeof(Fts5PoslistReader) * pPhrase->nTerm);

  /* Initialize a term iterator for each term in the phrase */
  for(i=0; i<pPhrase->nTerm; i++){
    Fts5ExprTerm *pTerm = &pPhrase->aTerm[i];
    int n = 0;
    int bFlag = 0;
    u8 *a = 0;
    if( pTerm->pSynonym ){
      Fts5Buffer buf = {0, 0, 0};
      rc = fts5ExprSynonymList(pTerm, pNode->iRowid, &buf, &a, &n);
      if( rc ){
        sqlite3_free(a);
        goto ismatch_out;
      }
      if( a==buf.p ) bFlag = 1;
    }else{
      a = (u8*)pTerm->pIter->pData;
      n = pTerm->pIter->nData;
    }
    sqlite3Fts5PoslistReaderInit(a, n, &aIter[i]);
    aIter[i].bFlag = (u8)bFlag;
    if( aIter[i].bEof ) goto ismatch_out;
  }

  while( 1 ){
    int bMatch;
    i64 iPos = aIter[0].iPos;
    do {
      bMatch = 1;
      for(i=0; i<pPhrase->nTerm; i++){
        Fts5PoslistReader *pPos = &aIter[i];
        i64 iAdj = iPos + i;
        if( pPos->iPos!=iAdj ){
          bMatch = 0;
          while( pPos->iPos<iAdj ){
            if( sqlite3Fts5PoslistReaderNext(pPos) ) goto ismatch_out;
          }
          if( pPos->iPos>iAdj ) iPos = pPos->iPos-i;
        }
      }
    }while( bMatch==0 );

    /* Append position iPos to the output */
    if( bFirst==0 || FTS5_POS2OFFSET(iPos)==0 ){
      rc = sqlite3Fts5PoslistWriterAppend(&pPhrase->poslist, &writer, iPos);
      if( rc!=SQLITE_OK ) goto ismatch_out;
    }

    for(i=0; i<pPhrase->nTerm; i++){
      if( sqlite3Fts5PoslistReaderNext(&aIter[i]) ) goto ismatch_out;
    }
  }

 ismatch_out:
  *pbMatch = (pPhrase->poslist.n>0);
  for(i=0; i<pPhrase->nTerm; i++){
    if( aIter[i].bFlag ) sqlite3_free((u8*)aIter[i].a);
  }
  if( aIter!=aStatic ) sqlite3_free(aIter);
  return rc;
}